

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanValue(Scanner *this)

{
  list_type *plVar1;
  int ToColumn;
  void *pvVar2;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&>
  iVar3;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
  I;
  ulong uVar4;
  long lVar5;
  iterator InsertPoint;
  bool bVar6;
  undefined1 local_68 [24];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar4 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                 super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                 super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                 super_SmallVectorBase.Size;
  if (uVar4 == 0) {
    if (this->FlowLevel == 0) {
      rollIndent(this,this->Column,TK_BlockMappingStart,(iterator)&(this->TokenQueue).List);
      bVar6 = this->FlowLevel == 0;
    }
    else {
      bVar6 = false;
    }
    this->IsSimpleKeyAllowed = bVar6;
  }
  else {
    pvVar2 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    lVar5 = uVar4 * 0x18;
    iVar3.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )((ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
             *)((long)pvVar2 + lVar5 + -0x18))->NodePtr;
    ToColumn = *(int *)((long)pvVar2 + lVar5 + -0x10);
    SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
              ((SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *)&this->SimpleKeys)
    ;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68._0_4_ = TK_Key;
    local_68._8_8_ = *(undefined8 *)((long)iVar3.I.NodePtr + 0x18);
    local_68._16_8_ = *(size_t *)((long)iVar3.I.NodePtr + 0x20);
    I.NodePtr = &(this->TokenQueue).List.Sentinel.
                 super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
    ;
    plVar1 = &(this->TokenQueue).List;
    do {
      I.NodePtr = *(node_pointer *)((long)I.NodePtr + 8);
      if ((list_type *)I.NodePtr == plVar1) break;
    } while ((ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
              )I.NodePtr != iVar3.I.NodePtr);
    if ((list_type *)I.NodePtr == plVar1) {
      this->Failed = true;
    }
    else {
      InsertPoint = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                    ::insert(&this->TokenQueue,(iterator)I.NodePtr,(Token *)local_68);
      rollIndent(this,ToColumn,TK_BlockMappingStart,InsertPoint);
      this->IsSimpleKeyAllowed = false;
    }
    std::__cxx11::string::~string((string *)&local_50);
    if ((list_type *)I.NodePtr == plVar1) {
      return false;
    }
  }
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_68._0_4_ = TK_Value;
  local_68._8_8_ = this->Current;
  local_68._16_8_ = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,(Token *)local_68);
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool Scanner::scanValue() {
  // If the previous token could have been a simple key, insert the key token
  // into the token queue.
  if (!SimpleKeys.empty()) {
    SimpleKey SK = SimpleKeys.pop_back_val();
    Token T;
    T.Kind = Token::TK_Key;
    T.Range = SK.Tok->Range;
    TokenQueueT::iterator i, e;
    for (i = TokenQueue.begin(), e = TokenQueue.end(); i != e; ++i) {
      if (i == SK.Tok)
        break;
    }
    if (i == e) {
      Failed = true;
      return false;
    }
    i = TokenQueue.insert(i, T);

    // We may also need to add a Block-Mapping-Start token.
    rollIndent(SK.Column, Token::TK_BlockMappingStart, i);

    IsSimpleKeyAllowed = false;
  } else {
    if (!FlowLevel)
      rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());
    IsSimpleKeyAllowed = !FlowLevel;
  }

  Token T;
  T.Kind = Token::TK_Value;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}